

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O0

int __thiscall CGL::CameraApertureTexture::init(CameraApertureTexture *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  size_type sVar4;
  void *this_00;
  reference pvVar5;
  int *piVar6;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> __first;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> __last;
  ostream *poVar7;
  reference pfVar8;
  iterator uitr;
  set<float,_std::greater<float>,_std::allocator<float>_> unique;
  Color curr_color;
  uchar curr_texel;
  int x;
  int y;
  int response;
  uint height;
  uint width;
  vector<unsigned_char,_std::allocator<unsigned_char>_> texels;
  string absolute_path;
  char *file;
  set<float,_std::greater<float>,_std::allocator<float>_> *in_stack_fffffffffffffe48;
  value_type_conflict1 *in_stack_fffffffffffffe58;
  vector<float,_std::allocator<float>_> *this_01;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe78;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  string *in_stack_fffffffffffffe90;
  uint *in_stack_fffffffffffffe98;
  uint *in_stack_fffffffffffffea0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffea8;
  _Self local_d8;
  _Self local_d0;
  float *local_c8;
  float *local_c0;
  Color local_84;
  value_type local_75;
  uint local_74;
  uint local_70 [5];
  uint local_5c;
  uint local_58;
  uint local_54;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  string local_38 [32];
  undefined8 local_18;
  EVP_PKEY_CTX *local_10;
  CameraApertureTexture *local_8;
  
  this->width = 0;
  this->height = 0;
  local_10 = ctx;
  local_8 = this;
  local_18 = std::__cxx11::string::c_str();
  resolve_path_abi_cxx11_(in_stack_fffffffffffffe78);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x154878);
  local_5c = lodepng::decode(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                             in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                             (LodePNGColorType)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                             (uint)in_stack_fffffffffffffe88);
  if (local_5c == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Loaded Aperture Function with (W, H): (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_54);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_58);
    std::operator<<(poVar3,")\n");
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"UNABLE TO LOAD APERTURE FUNCTION");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  this->width = (ulong)local_54;
  this->height = (ulong)local_58;
  std::vector<float,_std::allocator<float>_>::reserve
            (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
  poVar3 = std::operator<<((ostream *)&std::cout,"Number of Pixels to Process: ");
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_50);
  this_00 = (void *)std::ostream::operator<<(poVar3,sVar4);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  this->min_y = local_54;
  this->min_x = local_54;
  this->max_y = -1;
  this->max_x = -1;
  this->total_value = 0.0;
  for (local_70[0] = 0; local_70[0] < local_58; local_70[0] = local_70[0] + 1) {
    for (local_74 = 0; local_74 < local_54; local_74 = local_74 + 1) {
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&local_50,(ulong)((local_70[0] * local_54 + local_74) * 4));
      local_75 = *pvVar5;
      Color::Color(&local_84,&local_75);
      std::vector<float,_std::allocator<float>_>::push_back
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      this->total_value = (double)local_84.r + this->total_value;
      if (0.0 < local_84.r) {
        piVar6 = std::min<int>((int *)&local_74,&this->min_x);
        this->min_x = *piVar6;
        piVar6 = std::min<int>((int *)local_70,&this->min_y);
        this->min_y = *piVar6;
        piVar6 = std::max<int>((int *)&local_74,&this->max_x);
        this->max_x = *piVar6;
        piVar6 = std::max<int>((int *)local_70,&this->max_y);
        this->max_y = *piVar6;
      }
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Bounding Box (x1,y1) - (x2,y2): (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->min_x);
  poVar3 = std::operator<<(poVar3,", ");
  __first._M_current = (float *)std::ostream::operator<<(poVar3,this->min_y);
  __last._M_current = (float *)std::operator<<((ostream *)__first._M_current,") - (");
  poVar3 = (ostream *)std::ostream::operator<<(__last._M_current,this->max_x);
  poVar7 = std::operator<<(poVar3,", ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->max_y);
  std::operator<<(poVar7,")\n");
  this_01 = &this->aperture;
  local_c0 = (float *)std::vector<float,_std::allocator<float>_>::begin
                                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe48)
  ;
  local_c8 = (float *)std::vector<float,_std::allocator<float>_>::end
                                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe48)
  ;
  std::set<float,std::greater<float>,std::allocator<float>>::
  set<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
            ((set<float,_std::greater<float>,_std::allocator<float>_> *)poVar3,__first,__last);
  local_d0._M_node =
       (_Base_ptr)
       std::set<float,_std::greater<float>,_std::allocator<float>_>::begin
                 (in_stack_fffffffffffffe48);
  while( true ) {
    local_d8._M_node =
         (_Base_ptr)
         std::set<float,_std::greater<float>,_std::allocator<float>_>::end
                   (in_stack_fffffffffffffe48);
    bVar1 = std::operator!=(&local_d0,&local_d8);
    if (!bVar1) break;
    poVar3 = std::operator<<((ostream *)&std::cout,"Found unique value: ");
    pfVar8 = std::_Rb_tree_const_iterator<float>::operator*
                       ((_Rb_tree_const_iterator<float> *)0x154dc3);
    in_stack_fffffffffffffe48 =
         (set<float,_std::greater<float>,_std::allocator<float>_> *)
         std::ostream::operator<<(poVar3,*pfVar8);
    iVar2 = (int)((ulong)poVar3 >> 0x20);
    std::ostream::operator<<(in_stack_fffffffffffffe48,std::endl<char,std::char_traits<char>>);
    std::_Rb_tree_const_iterator<float>::operator++((_Rb_tree_const_iterator<float> *)this_01,iVar2)
    ;
  }
  std::set<float,_std::greater<float>,_std::allocator<float>_>::~set
            ((set<float,_std::greater<float>,_std::allocator<float>_> *)0x154e37);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)poVar7);
  iVar2 = std::__cxx11::string::~string(local_38);
  return iVar2;
}

Assistant:

void init(std::string aperture_filename) {
      width = 0;
      height = 0;

      /*
       * Process the pixels, capture values (need to experiment with the values it should take)
       */
      const char* file = aperture_filename.c_str();
      string absolute_path = resolve_path(file);

      vector<unsigned char> texels;
      unsigned int width, height;

      int response = lodepng::decode(texels, width, height, absolute_path);
      if (response) {
        cout << "UNABLE TO LOAD APERTURE FUNCTION" << endl;
      } else {
        cout << "Loaded Aperture Function with (W, H): (" << width << ", " << height << ")\n";
      }

      this->width = width;
      this->height = height;
      aperture.reserve(width * height);

      // Only Capture the Red Channel (Aperture Function is in Grayscale)
      cout << "Number of Pixels to Process: " << texels.size() << endl;

      // Channel = 0
      min_x = min_y = width;
      max_x = max_y = -1;
      total_value = 0.0;
      for (int y = 0; y < height; y++) {
        for (int x = 0; x < width; x++) {
          unsigned char curr_texel = texels[4 * (y * width + x)];
          Color curr_color = Color(&curr_texel);
          aperture.push_back(curr_color.r);
          total_value += curr_color.r;

          if (curr_color.r > 0) {
            min_x = min(x, min_x);
            min_y = min(y, min_y);

            max_x = max(x, max_x);
            max_y = max(y, max_y);
          }
        }
      }

      cout << "Bounding Box (x1,y1) - (x2,y2): (" << min_x << ", " << min_y
        << ") - (" << max_x << ", " << max_y << ")\n";

      // Debug Stuff
      set<float, greater<float>> unique(aperture.begin(), aperture.end());
      for (auto uitr = unique.begin(); uitr != unique.end(); uitr++) {
        cout << "Found unique value: " << *uitr << endl;
      }

    }